

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
 wabt::MakeUnique<wabt::AssertTrapCommandBase<(wabt::CommandType)8>>(void)

{
  AssertTrapCommandBase<(wabt::CommandType)8> *this;
  __uniq_ptr_data<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>,_true,_true>
  in_RDI;
  
  this = (AssertTrapCommandBase<(wabt::CommandType)8> *)operator_new(0x38);
  memset(this,0,0x38);
  AssertTrapCommandBase<(wabt::CommandType)8>::AssertTrapCommandBase(this);
  std::
  unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>>>
  ::unique_ptr<std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>>,void>
            ((unique_ptr<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)8>_*,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
                .super__Head_base<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)8>_*,_false>.
                _M_head_impl,this);
  return (__uniq_ptr_data<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>,_true,_true>
          )(tuple<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_*,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::AssertTrapCommandBase<(wabt::CommandType)8>,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)8>_*,_std::default_delete<wabt::AssertTrapCommandBase<(wabt::CommandType)8>_>_>
             .super__Head_base<0UL,_wabt::AssertTrapCommandBase<(wabt::CommandType)8>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}